

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O0

void __thiscall tli_window_manager::Box::Box(Box *this,Box *other)

{
  int iVar1;
  int local_20 [2];
  Box *local_18;
  Box *other_local;
  Box *this_local;
  
  this->_vptr_Box = (_func_int **)&PTR___cxa_pure_virtual_00114b18;
  local_20[1] = 0;
  local_18 = other;
  other_local = this;
  iVar1 = std::exchange<int,int>(&other->width_,local_20 + 1);
  this->width_ = iVar1;
  local_20[0] = 0;
  iVar1 = std::exchange<int,int>(&local_18->height_,local_20);
  this->height_ = iVar1;
  return;
}

Assistant:

Box::Box(Box &&other) noexcept:
        width_{std::exchange(other.width_, 0)}, height_{std::exchange(other.height_, 0)} {}